

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

char __thiscall
flatbuffers::Table::GetField<signed_char>(Table *this,voffset_t field,char defaultval)

{
  voffset_t vVar1;
  char local_21;
  voffset_t field_offset;
  char defaultval_local;
  voffset_t field_local;
  Table *this_local;
  
  vVar1 = GetOptionalFieldOffset(this,field);
  local_21 = defaultval;
  if (vVar1 != 0) {
    local_21 = ReadScalar<signed_char>(this + vVar1);
  }
  return local_21;
}

Assistant:

T GetField(voffset_t field, T defaultval) const {
    auto field_offset = GetOptionalFieldOffset(field);
    return field_offset ? ReadScalar<T>(&data_[field_offset]) : defaultval;
  }